

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O2

void __thiscall Player::areaNavigate(Player *this,int *x,int *y)

{
  char cVar1;
  int iVar2;
  ostream *poVar3;
  int recommendedHit [2];
  
  *x = 1;
  *y = 1;
  UI::clearScreen();
  getName_abi_cxx11_((string *)recommendedHit,this);
  poVar3 = std::operator<<((ostream *)&std::cout,(string *)recommendedHit);
  poVar3 = std::operator<<(poVar3,"\'s turn: ");
  std::endl<char,std::char_traits<char>>(poVar3);
  std::__cxx11::string::~string((string *)recommendedHit);
  printPointedEnemyArea(this,*x,*y);
  cVar1 = Keyboard::getche();
  if (this->role == true) {
    while( true ) {
      UI::clearScreen();
      if (cVar1 == 'e') break;
      getName_abi_cxx11_((string *)recommendedHit,this);
      poVar3 = std::operator<<((ostream *)&std::cout,(string *)recommendedHit);
      poVar3 = std::operator<<(poVar3,"\'s turn: ");
      std::endl<char,std::char_traits<char>>(poVar3);
      std::__cxx11::string::~string((string *)recommendedHit);
      if (cVar1 == 'a') {
        if (1 < *y) {
          iVar2 = *y + -1;
LAB_0010340e:
          *y = iVar2;
        }
LAB_00103410:
        printPointedEnemyArea(this,*x,*y);
      }
      else {
        if (cVar1 == 'd') {
          if (*y < 10) {
            iVar2 = *y + 1;
            goto LAB_0010340e;
          }
          goto LAB_00103410;
        }
        if (cVar1 == 's') {
          if (*x < 10) {
            iVar2 = *x + 1;
LAB_00103400:
            *x = iVar2;
          }
          goto LAB_00103410;
        }
        if (cVar1 == 'w') {
          if (1 < *x) {
            iVar2 = *x + -1;
            goto LAB_00103400;
          }
          goto LAB_00103410;
        }
        printPointedEnemyArea(this,*x,*y);
        poVar3 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        poVar3 = std::operator<<(poVar3,"[ERROR] Wrong direction");
        std::endl<char,std::char_traits<char>>(poVar3);
      }
      cVar1 = Keyboard::getche();
    }
  }
  else {
    AI::recommendHitForPlayer(this,recommendedHit);
    *x = recommendedHit[0];
    *y = recommendedHit[1];
  }
  return;
}

Assistant:

void Player::areaNavigate(int &x, int &y)
{
    char direction;
    x = 1; y = 1;
    UI::clearScreen();
    std::cout << getName() << "'s turn: " << std::endl;
    printPointedEnemyArea(x,y);
    direction = Keyboard::getche();
    if (!getRole()) //if computer plays
    {
        int recommendedHit[2];
        AI::recommendHitForPlayer(*this, recommendedHit);
        x = recommendedHit[0];
        y = recommendedHit[1];
        return;
    }
    bool errorOccured = false;
    while(direction != 'e')
    {
        UI::clearScreen();
        std::cout << getName() << "'s turn: " << std::endl;
        //std::cout << "|" << std::endl;
        switch(direction) {
            case 'w':
                if (x > 1) x--;
                break;
            case 'a':
                if (y > 1) y--;
                break;
            case 's':
                if (x < 10) x++;
                break;
            case 'd':
                if (y < 10) y++;
                break;

            default:
                errorOccured = true;

        }
        printPointedEnemyArea(x,y);
        if (errorOccured) {
            std::cout << std::endl << "[ERROR] Wrong direction" << std::endl;
            errorOccured = false;
        }
        //std::cout << (int) direction;
        direction = Keyboard::getche();
    }
//    UI::clearScreen();
//    std::cout << getName() << "'s turn: " << std::endl;
//    printPointedEnemyArea(x,y);
    //Keyboard::getch();
    UI::clearScreen();

}